

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

Vector crossProduct(Vector *a,Vector *b)

{
  Vector VVar1;
  
  VVar1.x = a->y * b->z - a->z * b->y;
  VVar1.y = a->z * b->x - b->z * a->x;
  VVar1.z = a->x * b->y - b->x * a->y;
  return VVar1;
}

Assistant:

Vector crossProduct(Vector const& a, Vector const& b)
{
  Vector vec;
  vec.x = a.y * b.z - b.y * a.z;
  vec.y = a.z * b.x - a.x * b.z;
  vec.z = a.x * b.y - a.y * b.x;
  return vec;
}